

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyAllElementsAndMatchersAreMatched
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  long *plVar2;
  size_t ilhs;
  ulong uVar3;
  MatchResultListener *pMVar4;
  ulong uVar5;
  bool bVar6;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  pointer local_80;
  char *local_78;
  ulong local_70;
  _Vector_base<char,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  local_50 = element_printouts;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_48,*(size_type *)matrix,
             (value_type *)&local_68,(allocator_type *)&local_78);
  local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_68,*(size_type *)(matrix + 8),
             (value_type *)&local_78,(allocator_type *)&local_80);
  for (uVar3 = 0; uVar3 < *(ulong *)matrix; uVar3 = uVar3 + 1) {
    for (uVar5 = 0; uVar5 < *(ulong *)(matrix + 8); uVar5 = uVar5 + 1) {
      bVar6 = *(char *)(uVar5 + *(ulong *)(matrix + 8) * uVar3 + *(long *)(matrix + 0x10)) == '\x01'
      ;
      local_48._M_impl.super__Vector_impl_data._M_start[uVar3] =
           local_48._M_impl.super__Vector_impl_data._M_start[uVar3] | bVar6;
      pbVar1 = (byte *)(CONCAT71(local_68._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_68._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar5);
      *pbVar1 = *pbVar1 | bVar6;
    }
  }
  local_78 = "where the following matchers don\'t match any elements:\n";
  bVar6 = true;
  local_80 = (pointer)0x0;
  while( true ) {
    if (local_68._M_impl.super__Vector_impl_data._M_finish +
        -CONCAT71(local_68._M_impl.super__Vector_impl_data._M_start._1_7_,
                  local_68._M_impl.super__Vector_impl_data._M_start._0_1_) <= local_80) break;
    if (local_80[CONCAT71(local_68._M_impl.super__Vector_impl_data._M_start._1_7_,
                          local_68._M_impl.super__Vector_impl_data._M_start._0_1_)] == '\0') {
      if (*(long *)(listener + 8) != 0) {
        pMVar4 = MatchResultListener::operator<<(listener,&local_78);
        pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [10])0x1875fc);
        pMVar4 = MatchResultListener::operator<<(pMVar4,(unsigned_long *)&local_80);
        MatchResultListener::operator<<(pMVar4,(char (*) [3])0x186401);
        plVar2 = *(long **)(*(long *)this + (long)local_80 * 8);
        (**(code **)(*plVar2 + 0x10))(plVar2,*(undefined8 *)(listener + 8));
        local_78 = ",\n";
      }
      bVar6 = false;
    }
    local_80 = local_80 + 1;
  }
  local_78 = "where the following elements don\'t match any matchers:\n";
  local_80 = "\nand ";
  if (bVar6) {
    local_80 = "";
  }
  local_70 = 0;
  while( true ) {
    if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48._M_impl.super__Vector_impl_data._M_start) <= local_70) break;
    if (local_48._M_impl.super__Vector_impl_data._M_start[local_70] == '\0') {
      if (*(long *)(listener + 8) != 0) {
        pMVar4 = MatchResultListener::operator<<(listener,&local_80);
        pMVar4 = MatchResultListener::operator<<(pMVar4,&local_78);
        pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [10])0x1875e3);
        pMVar4 = MatchResultListener::operator<<(pMVar4,&local_70);
        pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [3])0x186401);
        MatchResultListener::operator<<
                  (pMVar4,(local_50->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + local_70);
        local_78 = ",\n";
        local_80 = "";
      }
      bVar6 = false;
    }
    local_70 = local_70 + 1;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  return bVar6;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::
VerifyAllElementsAndMatchersAreMatched(
    const ::std::vector<string>& element_printouts,
    const MatchMatrix& matrix,
    MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi])
        continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei])
        continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}